

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int getBiomeCenters(Pos *pos,int *siz,int nmax,Generator *g,Range r,int match,int minsiz,int tol,
                   char *stop)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  Range r_00;
  int iVar5;
  int iVar6;
  int iVar7;
  void *__s;
  int *piVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  Pos PVar12;
  int iVar13;
  int iVar14;
  int z;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  size_t __size;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  double dVar21;
  BiomeFilter bf;
  int local_1d8;
  int local_1d4;
  int local_1c8;
  long local_1b8;
  long local_1a8;
  int local_144;
  int local_140;
  int iStack_13c;
  int iStack_138;
  uint uStack_134;
  uint local_130;
  undefined8 local_12c;
  ulong local_120;
  Pos *local_118;
  int *local_110;
  BiomeFilter local_108;
  
  if (minsiz < 2) {
    minsiz = 1;
  }
  __size = (long)(r.sz * r.sx) * 4;
  local_144 = match;
  local_118 = pos;
  local_110 = siz;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  iVar4 = 1;
  if (1 < tol) {
    iVar4 = tol;
  }
  local_120 = (ulong)(uint)r.z;
  iVar17 = g->mc;
  local_1d8 = iVar4;
  if (iVar17 < 0x16) {
    uVar19 = 8;
    if (0x1f < r.sz + r.sx) {
      uVar19 = (uint)(0x20 / (long)r.scale);
    }
    dVar21 = (double)(int)uVar19;
    dVar1 = floor((double)r.x / dVar21);
    dVar3 = floor((double)r.z / dVar21);
    dVar2 = ceil((double)(r.sx + r.x) / dVar21);
    dVar21 = ceil((double)(r.z + r.sz) / dVar21);
    iVar11 = (int)dVar21 - (int)dVar3;
    iVar13 = 0;
    setupBiomeFilter(&local_108,iVar17,0,&local_144,1,(int *)0x0,0,(int *)0x0,0);
    local_140 = r.scale;
    local_12c = 0x100000000;
    uStack_134 = uVar19;
    local_130 = uVar19;
    piVar8 = allocCache(g,r);
    if (0 < iVar11) {
      iVar17 = (int)dVar2 - (int)dVar1;
      do {
        if (0 < iVar17) {
          iVar5 = (iVar13 + (int)dVar3) * uVar19;
          iVar10 = 0;
          do {
            if ((stop != (char *)0x0) && (*stop != '\0')) break;
            iStack_13c = ((int)dVar1 + iVar10) * uVar19;
            r_00.x = iStack_13c;
            r_00.scale = local_140;
            r_00.z = iVar5;
            r_00.sx = uStack_134;
            r_00.sz = local_130;
            r_00.y = (undefined4)local_12c;
            r_00.sy = local_12c._4_4_;
            iStack_138 = iVar5;
            iVar6 = checkForBiomes(g,piVar8,r_00,0,g->seed,&local_108,stop);
            if ((iVar6 == 1) && (0 < (int)uVar19)) {
              iVar6 = (iStack_138 - r.z) * r.sx;
              uVar16 = 0;
              piVar15 = piVar8;
              do {
                iVar7 = (iStack_138 + (int)uVar16) - r.z;
                if ((-1 < iVar7) && (iVar7 < r.sz)) {
                  lVar20 = 0;
                  iVar7 = iStack_13c - r.x;
                  do {
                    if (iVar7 < r.sx && -1 < iVar7) {
                      *(undefined4 *)((long)__s + (ulong)(uint)(iVar6 + iVar7) * 4) =
                           *(undefined4 *)((long)piVar15 + lVar20);
                    }
                    lVar20 = lVar20 + 4;
                    iVar7 = iVar7 + 1;
                  } while ((ulong)uVar19 * 4 - lVar20 != 0);
                }
                uVar16 = uVar16 + 1;
                piVar15 = piVar15 + (int)uStack_134;
                iVar6 = iVar6 + r.sx;
              } while (uVar16 != uVar19);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != iVar17);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar11);
    }
    free(piVar8);
    iVar17 = match;
  }
  else {
    piVar8 = getBiomeParaLimits(iVar17,match);
    if (tol < 2) {
      dVar1 = floor(SQRT((double)minsiz) * 0.5);
      local_1d8 = (int)(dVar1 + 1.0);
    }
    iVar17 = -1;
    if (0 < r.sz) {
      iVar17 = 0;
      do {
        if (0 < r.sx) {
          iVar13 = 0;
          do {
            if ((stop != (char *)0x0) && (*stop != '\0')) break;
            lVar20 = 0;
            do {
              lVar9 = (long)*(int *)((long)&DAT_0012cb40 + lVar20);
              dVar1 = sampleDoublePerlin((DoublePerlinNoise *)((long)&g->field_5 + lVar9 * 0x28),
                                         (double)((r.x + iVar13) * r.scale) * 0.25,0.0,
                                         (double)((r.z + iVar17) * r.scale) * 0.25);
              if (((int)(dVar1 * 10000.0) < piVar8[lVar9 * 2]) ||
                 (piVar8[lVar9 * 2 + 1] < (int)(dVar1 * 10000.0))) {
                *(undefined4 *)((long)__s + (long)(r.sx * iVar17 + iVar13) * 4) = 0xfffffffe;
                break;
              }
              lVar20 = lVar20 + 4;
            } while (lVar20 != 0x14);
            iVar13 = iVar13 + local_1d8;
          } while (iVar13 < r.sx);
        }
        iVar17 = iVar17 + local_1d8;
      } while (iVar17 < r.sz);
      iVar17 = -1;
    }
  }
  local_1c8 = 0;
  applySeed(g,0,g->seed);
  if (0 < r.sz) {
    iVar13 = 0;
    local_1c8 = 0;
    do {
      if (0 < r.sx) {
        iVar11 = 0;
        do {
          if ((stop != (char *)0x0) && (*stop != '\0')) break;
          if (*(int *)((long)__s + (long)(r.sx * iVar13 + iVar11) * 4) == iVar17) {
            piVar8 = (int *)malloc((long)(r.sz * r.sx) * 0xc);
            *piVar8 = iVar11;
            piVar8[1] = iVar13;
            piVar8[2] = 0;
            uVar18 = 0;
            local_1d4 = 0;
            local_1b8 = 0;
            local_1a8 = 0;
            uVar16 = local_120;
            do {
              iVar5 = (int)uVar18;
              if ((stop != (char *)0x0) && (*stop != '\0')) {
                free(piVar8);
                goto LAB_0011551e;
              }
              iVar10 = piVar8[uVar18 * 3];
              iVar6 = piVar8[uVar18 * 3 + 1];
              lVar20 = (long)(iVar6 * r.sx + iVar10);
              iVar7 = *(int *)((long)__s + lVar20 * 4);
              if (iVar7 != 0x7fffffff) {
                iVar14 = piVar8[uVar18 * 3 + 2];
                *(undefined4 *)((long)__s + lVar20 * 4) = 0x7fffffff;
                z = iVar6 + (int)uVar16;
                if (0x15 < g->mc) {
                  iVar7 = getBiomeAt(g,r.scale,iVar10 + r.x,r.y,z);
                  uVar16 = local_120;
                }
                if (iVar7 == match) {
                  local_1a8 = local_1a8 + (iVar10 + r.x);
                  local_1b8 = local_1b8 + z;
                  local_1d4 = local_1d4 + 1;
                  iVar14 = 0;
                }
                else {
                  iVar14 = iVar14 + 1;
                  if (iVar4 <= iVar14) goto LAB_00115423;
                }
                local_108.tempsToFind._0_4_ = iVar10;
                local_108.tempsToFind._4_4_ = iVar6 + -1;
                local_108.otempToFind._0_4_ = iVar14;
                local_108.otempToFind._4_4_ = iVar10;
                local_108.majorToFind._0_4_ = iVar6 + 1;
                local_108.majorToFind._4_4_ = iVar14;
                local_108.edgesToFind._0_4_ = iVar10 + -1;
                local_108.edgesToFind._4_4_ = iVar6;
                local_108.raresToFind._0_4_ = iVar14;
                local_108.raresToFind._4_4_ = iVar10 + 1;
                local_108.raresToFindM._0_4_ = iVar6;
                local_108.raresToFindM._4_4_ = iVar14;
                lVar20 = 0;
                do {
                  iVar5 = *(int *)((long)&local_108.tempsToFind + lVar20);
                  if ((((-1 < iVar5) && (iVar5 < r.sx)) &&
                      (iVar10 = *(int *)((long)&local_108.tempsToFind + lVar20 + 4), -1 < iVar10))
                     && ((iVar10 < r.sz &&
                         (*(int *)((long)__s + (ulong)(uint)(iVar10 * r.sx + iVar5) * 4) !=
                          0x7fffffff)))) {
                    iVar5 = (int)uVar18;
                    uVar18 = (ulong)(iVar5 + 1);
                    piVar8[(long)iVar5 * 3 + 2] = *(int *)((long)&local_108.otempToFind + lVar20);
                    *(undefined8 *)(piVar8 + (long)iVar5 * 3) =
                         *(undefined8 *)((long)&local_108.tempsToFind + lVar20);
                  }
                  iVar5 = (int)uVar18;
                  lVar20 = lVar20 + 0xc;
                } while (lVar20 != 0x30);
              }
LAB_00115423:
              uVar18 = (ulong)(iVar5 - 1);
            } while (0 < iVar5);
            free(piVar8);
            if (minsiz <= local_1d4) {
              dVar1 = round(((double)local_1b8 / (double)local_1d4 + 0.5) * (double)r.scale);
              dVar3 = round(((double)local_1a8 / (double)local_1d4 + 0.5) * (double)r.scale);
              PVar12.x = (int)dVar3;
              PVar12.z = (int)dVar1;
              local_118[local_1c8] = PVar12;
              if (local_110 != (int *)0x0) {
                local_110[local_1c8] = local_1d4;
              }
              local_1c8 = local_1c8 + 1;
              if (nmax <= local_1c8) goto LAB_0011553c;
            }
          }
LAB_0011551e:
          iVar11 = iVar11 + local_1d8;
        } while (iVar11 < r.sx);
      }
      iVar13 = iVar13 + local_1d8;
    } while (iVar13 < r.sz);
  }
LAB_0011553c:
  free(__s);
  return local_1c8;
}

Assistant:

int getBiomeCenters(Pos *pos, int *siz, int nmax, Generator *g, Range r,
    int match, int minsiz, int tol, volatile char *stop)
{
    if (minsiz <= 0)
        minsiz = 1;
    int i, j, k, n = 0;
    int *ids = (int*) malloc(r.sx*r.sz * sizeof(int));
    memset(ids, -1, r.sx*r.sz * sizeof(int));
    if (tol <= 0)
        tol = 1;
    int step = tol;
    struct locate_info_t info;
    info.g = g;
    info.ids = ids;
    info.r = r;
    info.stop = stop;
    info.match = match;
    info.tol = tol;

    if (g->mc >= MC_1_18)
    {
        const int *lim = getBiomeParaLimits(g->mc, match);

        int para[] = {
            NP_TEMPERATURE,
            NP_HUMIDITY,
            NP_EROSION,
            NP_CONTINENTALNESS,
            NP_WEIRDNESS,
        };
        int npara = sizeof(para) / sizeof(para[0]);
        if (tol == 1)
            step = 1 + floor(sqrt(minsiz) * 0.5);

        for (j = 0; j < r.sz; j += step)
        {
            for (i = 0; i < r.sx; i += step)
            {
                if (stop && *stop)
                    break;
                for (k = 0; k < npara; k++)
                {
                    const int *plim = lim + 2*para[k];
                    if (plim[0] == INT_MIN && plim[1] == INT_MAX)
                        continue;
                    DoublePerlinNoise *dpn = &g->bn.climate[para[k]];
                    double px = (r.x+i) * r.scale / 4.0;
                    double pz = (r.z+j) * r.scale / 4.0;
                    int p = 10000 * sampleDoublePerlin(dpn, px, 0, pz);
                    if (p < plim[0] || p > plim[1])
                    {
                        ids[j*r.sx + i] = -2;
                        break;
                    }
                }
            }
        }
        match = -1; // id entries that are still -1 are our candidates
    }
    else // 1.17-
    {
        int ts = 32 / r.scale;
        if (r.sx + r.sz < 32)
            ts = 8;

        int tx = (int) floor(r.x / (double)ts);
        int tz = (int) floor(r.z / (double)ts);
        int tw = (int) ceil((r.x+r.sx) / (double)ts) - tx;
        int th = (int) ceil((r.z+r.sz) / (double)ts) - tz;
        int ti, tj;

        BiomeFilter bf;
        setupBiomeFilter(&bf, g->mc, 0, &match, 1, 0, 0, 0, 0);
        //applySeed(g, 0, g->seed);

        Range tr = { r.scale, 0, 0, ts, ts, 0, 1 };
        int *cache = allocCache(g, r);

        for (tj = 0; tj < th; tj++)
        {
            for (ti = 0; ti < tw; ti++)
            {
                if (stop && *stop)
                    break;
                tr.x = (tx+ti) * ts;
                tr.z = (tz+tj) * ts;
                if (checkForBiomes(g, cache, tr, DIM_OVERWORLD, g->seed,
                    &bf, stop) != 1)
                {
                    continue;
                }
                for (j = 0; j < ts; j++)
                {
                    int jj = tr.z + j - r.z;
                    if (jj < 0 || jj >= r.sz)
                        continue;
                    for (i = 0; i < ts; i++)
                    {
                        int ii = tr.x + i - r.x;
                        if (ii < 0 || ii >= r.sx)
                            continue;
                        ids[jj*r.sx + ii] = cache[j*tr.sx + i];
                    }
                }
            }
        }
        free(cache);
    }

    applySeed(g, DIM_OVERWORLD, g->seed);
    for (j = 0; j < r.sz; j += step)
    {
        for (i = 0; i < r.sx; i += step)
        {
            if (stop && *stop)
                break;
            if (ids[j*r.sx + i] != match)
                continue;
            Pos center;
            int area = floodFillGen(&info, i, j, &center);
            if (area >= minsiz)
            {
                pos[n] = center;
                if (siz) siz[n] = area;
                if (++n >= nmax)
                    goto L_end;
            }
        }
    }

L_end:
    free(ids);

    return n;
}